

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-bin-cursor.c
# Opt level: O3

int coda_bin_cursor_get_bit_size(coda_cursor *cursor,int64_t *bit_size)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  coda_type *pcVar4;
  coda_cursor spec_cursor;
  coda_cursor cStack_328;
  
  pcVar4 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar4->format) {
    pcVar4 = *(coda_type **)&pcVar4->type_class;
  }
  if (pcVar4->bit_size < 0) {
    uVar1 = pcVar4->type_class;
    if (uVar1 - 2 < 4) {
      if (pcVar4->size_expr != (coda_expression *)0x0) {
        iVar2 = coda_expression_eval_integer(pcVar4->size_expr,cursor,bit_size);
        if (iVar2 == 0) {
          lVar3 = *bit_size;
          if (pcVar4->bit_size == -8) {
            lVar3 = lVar3 << 3;
            *bit_size = lVar3;
          }
          if (-1 < lVar3) {
            return 0;
          }
          coda_set_error(-300,"calculated size is negative (%ld bits)");
        }
        else {
          coda_add_error_message(" for size expression");
        }
        coda_cursor_add_to_error_message(cursor);
        return -1;
      }
      *bit_size = -1;
    }
    else {
      if (uVar1 < 2) {
        iVar2 = coda_ascbin_cursor_get_bit_size(cursor,bit_size);
        return iVar2;
      }
      if (uVar1 == 6) {
        memcpy(&cStack_328,cursor,0x310);
        iVar2 = coda_ascbin_cursor_use_base_type_of_special_type(&cStack_328);
        if (iVar2 != 0) {
          return -1;
        }
        iVar2 = coda_cursor_get_bit_size(&cStack_328,bit_size);
        if (iVar2 != 0) {
          return -1;
        }
      }
    }
  }
  else {
    *bit_size = pcVar4->bit_size;
  }
  return 0;
}

Assistant:

int coda_bin_cursor_get_bit_size(const coda_cursor *cursor, int64_t *bit_size)
{
    coda_type *type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

    if (type->bit_size >= 0)
    {
        *bit_size = type->bit_size;
        return 0;
    }

    switch (type->type_class)
    {
        case coda_record_class:
        case coda_array_class:
            return coda_ascbin_cursor_get_bit_size(cursor, bit_size);
        case coda_integer_class:
        case coda_real_class:
        case coda_text_class:
        case coda_raw_class:
            if (type->size_expr == NULL)
            {
                *bit_size = -1;
            }
            else
            {
                if (coda_expression_eval_integer(type->size_expr, cursor, bit_size) != 0)
                {
                    coda_add_error_message(" for size expression");
                    coda_cursor_add_to_error_message(cursor);
                    return -1;
                }
                if (type->bit_size == -8)
                {
                    *bit_size *= 8;
                }
                if (*bit_size < 0)
                {
                    coda_set_error(CODA_ERROR_PRODUCT, "calculated size is negative (%ld bits)", (long)*bit_size);
                    coda_cursor_add_to_error_message(cursor);
                    return -1;
                }
            }
            break;
        case coda_special_class:
            {
                coda_cursor spec_cursor;

                spec_cursor = *cursor;
                if (coda_ascbin_cursor_use_base_type_of_special_type(&spec_cursor) != 0)
                {
                    return -1;
                }
                if (coda_cursor_get_bit_size(&spec_cursor, bit_size) != 0)
                {
                    return -1;
                }
            }
            break;
    }

    return 0;
}